

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_mkdir(char *_dname)

{
  undefined1 *ptr;
  size_t ptr_00;
  char *_dname_00;
  size_t sVar1;
  ulong len_00;
  char *dname_00;
  undefined1 **ppuVar2;
  undefined1 *local_38;
  ulong local_30;
  size_t len;
  char *dname;
  char *pcStack_18;
  int retval;
  char *_dname_local;
  
  ppuVar2 = &local_38;
  dname._4_4_ = 0;
  pcStack_18 = _dname;
  if (_dname == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    _dname_local._4_4_ = 0;
  }
  else {
    sVar1 = strlen(_dname);
    len_00 = sVar1 + 1;
    if (len_00 < 0x100) {
      ppuVar2 = (undefined1 **)((long)&local_38 - (sVar1 + 0x18 & 0xfffffffffffffff0));
      local_38 = (undefined1 *)ppuVar2;
    }
    else {
      local_38 = (undefined1 *)0x0;
    }
    ptr = local_38;
    local_30 = len_00;
    *(undefined8 *)((long)ppuVar2 + -8) = 0x10955d;
    dname_00 = (char *)__PHYSFS_initSmallAlloc(ptr,len_00);
    _dname_00 = pcStack_18;
    len = (size_t)dname_00;
    if (dname_00 == (char *)0x0) {
      *(undefined8 *)((long)ppuVar2 + -8) = 0x109572;
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      _dname_local._4_4_ = 0;
    }
    else {
      *(undefined8 *)((long)ppuVar2 + -8) = 0x10958a;
      dname._4_4_ = doMkdir(_dname_00,dname_00);
      ptr_00 = len;
      *(undefined8 *)((long)ppuVar2 + -8) = 0x109596;
      __PHYSFS_smallFree((void *)ptr_00);
      _dname_local._4_4_ = dname._4_4_;
    }
  }
  return _dname_local._4_4_;
}

Assistant:

int PHYSFS_mkdir(const char *_dname)
{
    int retval = 0;
    char *dname;
    size_t len;

    BAIL_IF(!_dname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    len = strlen(_dname) + 1;
    dname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF(!dname, PHYSFS_ERR_OUT_OF_MEMORY, 0);
    retval = doMkdir(_dname, dname);
    __PHYSFS_smallFree(dname);
    return retval;
}